

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraphTest.cpp
# Opt level: O2

void __thiscall DynamicGraphTest::testInit(DynamicGraphTest *this)

{
  DynamicGraph *this_00;
  uint __line;
  unsigned_long uVar1;
  ostream *poVar2;
  EVP_PKEY_CTX *in_RSI;
  char *__assertion;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  initializer_list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> __l;
  allocator_type local_121;
  list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  expectedVirtualEdges;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_108;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_e8;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_c8;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_a8;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> local_88;
  unsigned_long local_70;
  unsigned_long uStack_68;
  property_type *local_60;
  unsigned_long local_58;
  unsigned_long uStack_50;
  property_type *local_48;
  unsigned_long local_40;
  unsigned_long uStack_38;
  property_type *local_30;
  
  this_00 = &this->G;
  DynamicGraph::init(this_00,in_RSI);
  uVar1 = DynamicGraph::getLevel(this_00,0);
  if (uVar1 == 0) {
    uVar1 = DynamicGraph::getLevel(this_00,1);
    if (uVar1 == 1) {
      uVar1 = DynamicGraph::getLevel(this_00,2);
      if (uVar1 == 1) {
        uVar1 = DynamicGraph::getLevel(this_00,3);
        if (uVar1 == 2) {
          uVar1 = DynamicGraph::getLevel(this_00,4);
          if (uVar1 == 1) {
            uVar1 = DynamicGraph::getLevel(this_00,5);
            if (uVar1 == 2) {
              uVar1 = DynamicGraph::getLevel(this_00,6);
              if (uVar1 == 2) {
                uVar1 = DynamicGraph::getLevel(this_00,7);
                if (uVar1 == 1) {
                  uVar1 = DynamicGraph::getLevel(this_00,8);
                  if (uVar1 == 2) {
                    uVar1 = DynamicGraph::getLevel(this_00,9);
                    if (uVar1 == 1) {
                      uVar1 = DynamicGraph::getLevel(this_00,10);
                      if (uVar1 == 2) {
                        uVar1 = DynamicGraph::getLevel(this_00,0xb);
                        if (uVar1 == 2) {
                          uVar1 = DynamicGraph::getLevel(this_00,0xc);
                          if (uVar1 == 3) {
                            uVar1 = DynamicGraph::getLevel(this_00,0xd);
                            if (uVar1 == 3) {
                              uVar1 = DynamicGraph::getLevel(this_00,0xe);
                              if (uVar1 == 4) {
                                uVar1 = DynamicGraph::getLevel(this_00,0xf);
                                if (uVar1 == 3) {
                                  uVar1 = DynamicGraph::getLevel(this_00,0x10);
                                  if (uVar1 == 1) {
                                    uVar1 = DynamicGraph::getLevel(this_00,0x11);
                                    if (uVar1 == 2) {
                                      uVar1 = DynamicGraph::getLevel(this_00,0x12);
                                      if (uVar1 == 3) {
                                        uVar1 = DynamicGraph::getLevel(this_00,0x13);
                                        if (uVar1 == 2) {
                                          uVar1 = DynamicGraph::getComponent(this_00,0);
                                          if (uVar1 == 1) {
                                            uVar1 = DynamicGraph::getComponent(this_00,1);
                                            if (uVar1 == 1) {
                                              uVar1 = DynamicGraph::getComponent(this_00,2);
                                              if (uVar1 == 1) {
                                                uVar1 = DynamicGraph::getComponent(this_00,3);
                                                if (uVar1 == 1) {
                                                  uVar1 = DynamicGraph::getComponent(this_00,4);
                                                  if (uVar1 == 2) {
                                                    uVar1 = DynamicGraph::getComponent(this_00,5);
                                                    if (uVar1 == 2) {
                                                      uVar1 = DynamicGraph::getComponent(this_00,6);
                                                      if (uVar1 == 2) {
                                                        uVar1 = DynamicGraph::getComponent
                                                                          (this_00,7);
                                                        if (uVar1 == 3) {
                                                          uVar1 = DynamicGraph::getComponent
                                                                            (this_00,8);
                                                          if (uVar1 == 3) {
                                                            uVar1 = DynamicGraph::getComponent
                                                                              (this_00,9);
                                                            if (uVar1 == 4) {
                                                              uVar1 = DynamicGraph::getComponent
                                                                                (this_00,10);
                                                              if (uVar1 == 4) {
                                                                uVar1 = DynamicGraph::getComponent
                                                                                  (this_00,0xb);
                                                                if (uVar1 == 4) {
                                                                  uVar1 = DynamicGraph::getComponent
                                                                                    (this_00,0xc);
                                                                  if (uVar1 == 4) {
                                                                    uVar1 = DynamicGraph::
                                                                            getComponent(this_00,0xd
                                                                                        );
                                                                    if (uVar1 == 4) {
                                                                      uVar1 = DynamicGraph::
                                                                              getComponent(this_00,
                                                  0xe);
                                                  if (uVar1 == 4) {
                                                    uVar1 = DynamicGraph::getComponent(this_00,0xf);
                                                    if (uVar1 == 4) {
                                                      uVar1 = DynamicGraph::getComponent
                                                                        (this_00,0x10);
                                                      if (uVar1 == 5) {
                                                        uVar1 = DynamicGraph::getComponent
                                                                          (this_00,0x11);
                                                        if (uVar1 == 5) {
                                                          uVar1 = DynamicGraph::getComponent
                                                                            (this_00,0x12);
                                                          if (uVar1 == 5) {
                                                            uVar1 = DynamicGraph::getComponent
                                                                              (this_00,0x13);
                                                            if (uVar1 == 5) {
                                                              boost::
                                                  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                                                            (&local_a8,(boost *)0x0,4,
                                                             (vertex_descriptor)this_00,in_R8);
                                                  local_88.m_eproperty = local_a8.first.m_eproperty;
                                                  local_88.
                                                  super_edge_base<boost::undirected_tag,_unsigned_long>
                                                  .m_source = local_a8.first.
                                                                                                                            
                                                  super_edge_base<boost::undirected_tag,_unsigned_long>
                                                  .m_source;
                                                  local_88.
                                                  super_edge_base<boost::undirected_tag,_unsigned_long>
                                                  .m_target = local_a8.first.
                                                                                                                            
                                                  super_edge_base<boost::undirected_tag,_unsigned_long>
                                                  .m_target;
                                                  boost::
                                                  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                                                            (&local_c8,(boost *)0x0,7,
                                                             (vertex_descriptor)this_00,in_R8);
                                                  local_60 = local_c8.first.m_eproperty;
                                                  local_70 = local_c8.first.
                                                                                                                          
                                                  super_edge_base<boost::undirected_tag,_unsigned_long>
                                                  .m_source;
                                                  uStack_68 = local_c8.first.
                                                                                                                            
                                                  super_edge_base<boost::undirected_tag,_unsigned_long>
                                                  .m_target;
                                                  boost::
                                                  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                                                            (&local_e8,(boost *)0x0,9,
                                                             (vertex_descriptor)this_00,in_R8);
                                                  local_48 = local_e8.first.m_eproperty;
                                                  local_58 = local_e8.first.
                                                                                                                          
                                                  super_edge_base<boost::undirected_tag,_unsigned_long>
                                                  .m_source;
                                                  uStack_50 = local_e8.first.
                                                                                                                            
                                                  super_edge_base<boost::undirected_tag,_unsigned_long>
                                                  .m_target;
                                                  boost::
                                                  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                                                            (&local_108,(boost *)0x0,0x10,
                                                             (vertex_descriptor)this_00,in_R8);
                                                  local_30 = local_108.first.m_eproperty;
                                                  local_40 = local_108.first.
                                                                                                                          
                                                  super_edge_base<boost::undirected_tag,_unsigned_long>
                                                  .m_source;
                                                  uStack_38 = local_108.first.
                                                                                                                            
                                                  super_edge_base<boost::undirected_tag,_unsigned_long>
                                                  .m_target;
                                                  __l._M_len = 4;
                                                  __l._M_array = &local_88;
                                                  std::__cxx11::
                                                  list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                                                  ::list(&expectedVirtualEdges,__l,&local_121);
                                                  testVirtualEdges(this,&expectedVirtualEdges);
                                                  poVar2 = std::operator<<((ostream *)&std::cout,
                                                                           "[+] test init OK!");
                                                  std::endl<char,std::char_traits<char>>(poVar2);
                                                  std::__cxx11::
                                                  _List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                                                  ::_M_clear(&expectedVirtualEdges.
                                                                                                                            
                                                  super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                                                  );
                                                  return;
                                                  }
                                                  __assertion = "G.getComponent(19)==5";
                                                  __line = 0x59;
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(18)==5";
                                                    __line = 0x58;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(17)==5";
                                                    __line = 0x57;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(16)==5";
                                                    __line = 0x56;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(15)==4";
                                                    __line = 0x55;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(14)==4";
                                                    __line = 0x54;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(13)==4";
                                                    __line = 0x53;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(12)==4";
                                                    __line = 0x52;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(11)==4";
                                                    __line = 0x51;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(10)==4";
                                                    __line = 0x50;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(9)==4";
                                                    __line = 0x4f;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(8)==3";
                                                    __line = 0x4e;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(7)==3";
                                                    __line = 0x4d;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(6)==2";
                                                    __line = 0x4c;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(5)==2";
                                                    __line = 0x4b;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "G.getComponent(4)==2";
                                                    __line = 0x4a;
                                                  }
                                                }
                                                else {
                                                  __assertion = "G.getComponent(3)==1";
                                                  __line = 0x49;
                                                }
                                              }
                                              else {
                                                __assertion = "G.getComponent(2)==1";
                                                __line = 0x48;
                                              }
                                            }
                                            else {
                                              __assertion = "G.getComponent(1)==1";
                                              __line = 0x47;
                                            }
                                          }
                                          else {
                                            __assertion = "G.getComponent(0)==1";
                                            __line = 0x46;
                                          }
                                        }
                                        else {
                                          __assertion = "G.getLevel(19)==2";
                                          __line = 0x43;
                                        }
                                      }
                                      else {
                                        __assertion = "G.getLevel(18)==3";
                                        __line = 0x42;
                                      }
                                    }
                                    else {
                                      __assertion = "G.getLevel(17)==2";
                                      __line = 0x41;
                                    }
                                  }
                                  else {
                                    __assertion = "G.getLevel(16)==1";
                                    __line = 0x40;
                                  }
                                }
                                else {
                                  __assertion = "G.getLevel(15)==3";
                                  __line = 0x3f;
                                }
                              }
                              else {
                                __assertion = "G.getLevel(14)==4";
                                __line = 0x3e;
                              }
                            }
                            else {
                              __assertion = "G.getLevel(13)==3";
                              __line = 0x3d;
                            }
                          }
                          else {
                            __assertion = "G.getLevel(12)==3";
                            __line = 0x3c;
                          }
                        }
                        else {
                          __assertion = "G.getLevel(11)==2";
                          __line = 0x3b;
                        }
                      }
                      else {
                        __assertion = "G.getLevel(10)==2";
                        __line = 0x3a;
                      }
                    }
                    else {
                      __assertion = "G.getLevel(9)==1";
                      __line = 0x39;
                    }
                  }
                  else {
                    __assertion = "G.getLevel(8)==2";
                    __line = 0x38;
                  }
                }
                else {
                  __assertion = "G.getLevel(7)==1";
                  __line = 0x37;
                }
              }
              else {
                __assertion = "G.getLevel(6)==2";
                __line = 0x36;
              }
            }
            else {
              __assertion = "G.getLevel(5)==2";
              __line = 0x35;
            }
          }
          else {
            __assertion = "G.getLevel(4)==1";
            __line = 0x34;
          }
        }
        else {
          __assertion = "G.getLevel(3)==2";
          __line = 0x33;
        }
      }
      else {
        __assertion = "G.getLevel(2)==1";
        __line = 0x32;
      }
    }
    else {
      __assertion = "G.getLevel(1)==1";
      __line = 0x31;
    }
  }
  else {
    __assertion = "G.getLevel(0)==0";
    __line = 0x30;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                ,__line,"void DynamicGraphTest::testInit()");
}

Assistant:

void DynamicGraphTest::testInit()
{
    this->G.init();

    // test levels
    assert(G.getLevel(0)==0);
    assert(G.getLevel(1)==1);
    assert(G.getLevel(2)==1);
    assert(G.getLevel(3)==2);
    assert(G.getLevel(4)==1);
    assert(G.getLevel(5)==2);
    assert(G.getLevel(6)==2);
    assert(G.getLevel(7)==1);
    assert(G.getLevel(8)==2);
    assert(G.getLevel(9)==1);
    assert(G.getLevel(10)==2);
    assert(G.getLevel(11)==2);
    assert(G.getLevel(12)==3);
    assert(G.getLevel(13)==3);
    assert(G.getLevel(14)==4);
    assert(G.getLevel(15)==3);
    assert(G.getLevel(16)==1);
    assert(G.getLevel(17)==2);
    assert(G.getLevel(18)==3);
    assert(G.getLevel(19)==2);

    // test components
    assert(G.getComponent(0)==1);
    assert(G.getComponent(1)==1);
    assert(G.getComponent(2)==1);
    assert(G.getComponent(3)==1);
    assert(G.getComponent(4)==2);
    assert(G.getComponent(5)==2);
    assert(G.getComponent(6)==2);
    assert(G.getComponent(7)==3);
    assert(G.getComponent(8)==3);
    assert(G.getComponent(9)==4);
    assert(G.getComponent(10)==4);
    assert(G.getComponent(11)==4);
    assert(G.getComponent(12)==4);
    assert(G.getComponent(13)==4);
    assert(G.getComponent(14)==4);
    assert(G.getComponent(15)==4);
    assert(G.getComponent(16)==5);
    assert(G.getComponent(17)==5);
    assert(G.getComponent(18)==5);
    assert(G.getComponent(19)==5);

    // test virtual edges
    std::list<Edge> expectedVirtualEdges = {
            edge(0, 4, G).first,
            edge(0, 7, G).first,
            edge(0, 9, G).first,
            edge(0, 16, G).first
    };
    testVirtualEdges(expectedVirtualEdges);


    std::cout << "[+] test init OK!" << std::endl;
}